

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterSeekInit(Fts5Index *p,u8 *pTerm,int nTerm,int flags,Fts5StructureSegment *pSeg,
                        Fts5SegIter *pIter)

{
  int *pRc;
  Vdbe *p_00;
  sqlite3_mutex *psVar1;
  Fts5StructureSegment *pFVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  u32 uVar10;
  char *zSql;
  Mem *pMem;
  ulong uVar11;
  Fts5Data *pFVar12;
  code *pcVar13;
  uint uVar14;
  Fts5Data *pFVar15;
  long lVar16;
  uint uVar17;
  char cVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  Vdbe *p_1;
  long lVar22;
  u8 *puVar23;
  long in_FS_OFFSET;
  bool bVar24;
  u32 nNew;
  u32 nKeep;
  int ret;
  int local_90;
  Fts5Data *local_80;
  uint local_6c;
  u32 local_4c;
  u32 local_48;
  u32 local_44;
  u32 local_40;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter->pSeg = (Fts5StructureSegment *)0x0;
  pIter->flags = 0;
  pIter->iLeafPgno = 0;
  pIter->iRowid = 0;
  pIter->nPos = 0;
  pIter->bDel = '\0';
  *(undefined3 *)&pIter->field_0x7d = 0;
  (pIter->term).p = (u8 *)0x0;
  (pIter->term).n = 0;
  (pIter->term).nSpace = 0;
  pIter->aRowidOffset = (int *)0x0;
  pIter->pDlidx = (Fts5DlidxIter *)0x0;
  pIter->iPgidxOff = 0;
  pIter->iEndofDoclist = 0;
  pIter->iRowidOffset = 0;
  pIter->nRowidOffset = 0;
  pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
  pIter->iTermLeafPgno = 0;
  pIter->iTermLeafOffset = 0;
  pIter->iLeafOffset = 0;
  pIter->pTombArray = (Fts5TombstoneArray *)0x0;
  pIter->pLeaf = (Fts5Data *)0x0;
  pIter->pNextLeaf = (Fts5Data *)0x0;
  pIter->pSeg = pSeg;
  if (p->pIdxSelect == (sqlite3_stmt *)0x0) {
    zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term<=? ORDER BY term DESC LIMIT 1"
                           ,p->pConfig->zDb,p->pConfig->zName);
    fts5IndexPrepareStmt(p,&p->pIdxSelect,zSql);
  }
  if (p->rc == 0) {
    p_00 = (Vdbe *)p->pIdxSelect;
    pRc = &p->rc;
    iVar8 = 1;
    sqlite3_bind_int64((sqlite3_stmt *)p_00,1,(long)pSeg->iSegid);
    bindText((sqlite3_stmt *)p_00,2,pTerm,(long)nTerm,(_func_void_void_ptr *)0x0,'\0');
    iVar7 = sqlite3_step((sqlite3_stmt *)p_00);
    bVar24 = true;
    if (iVar7 == 100) {
      pMem = columnMem((sqlite3_stmt *)p_00,0);
      uVar11 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure((sqlite3_stmt *)p_00);
      iVar8 = (int)uVar11 >> 1;
      bVar24 = (uVar11 & 1) == 0;
    }
    iVar7 = sqlite3_reset((sqlite3_stmt *)p_00);
    *pRc = iVar7;
    iVar7 = vdbeUnbind(p_00,1);
    if ((iVar7 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
    iVar7 = pSeg->pgnoFirst;
    iVar9 = iVar7;
    if (iVar7 < iVar8) {
      iVar9 = iVar8;
    }
    pIter->iLeafPgno = iVar9 + -1;
    fts5SegIterNextPage(p,pIter);
    pFVar12 = pIter->pLeaf;
    if (pFVar12 != (Fts5Data *)0x0) {
      local_3c = 0xaaaaaaaa;
      puVar23 = pFVar12->p;
      uVar20 = pFVar12->nn;
      uVar17 = 0;
      local_40 = 0;
      local_44 = 0;
      local_48 = 0xaaaaaaaa;
      local_6c = pFVar12->szLeaf;
      iVar9 = sqlite3Fts5GetVarint32(puVar23 + local_6c,&local_48);
      local_3c = local_48;
      if (uVar20 < local_48) {
        *pRc = 0x10b;
        local_3c = local_48;
      }
      else {
        local_6c = iVar9 + local_6c;
        uVar10 = local_48;
        uVar21 = local_48;
LAB_001e733b:
        local_44 = (u32)puVar23[uVar21];
        if ((char)puVar23[uVar21] < '\0') {
          iVar9 = sqlite3Fts5GetVarint32(puVar23 + uVar21,&local_44);
          uVar21 = uVar21 + iVar9;
        }
        else {
          uVar21 = uVar21 + 1;
        }
        bVar4 = true;
        if (local_40 < uVar17) {
LAB_001e7474:
          if ((flags & 8U) != 0) {
            local_48 = uVar10;
            local_3c = uVar21;
            if (!bVar4) goto LAB_001e74ad;
            goto LAB_001e7561;
          }
          local_48 = uVar10;
          local_3c = uVar21;
          sqlite3_free(pFVar12);
          pIter->pLeaf = (Fts5Data *)0x0;
          goto LAB_001e7634;
        }
        if (local_40 == uVar17) {
          uVar3 = nTerm - uVar17;
          if (local_44 < nTerm - uVar17) {
            uVar3 = local_44;
          }
          if (uVar3 == 0) {
            uVar14 = 0;
          }
          else {
            uVar11 = 0;
            do {
              uVar14 = (uint)uVar11;
              if (puVar23[uVar21 + uVar14] != pTerm[uVar17 + uVar14]) break;
              uVar11 = uVar11 + 1;
              uVar14 = uVar3;
            } while (uVar3 != uVar11);
          }
          uVar17 = uVar17 + uVar14;
          if (uVar17 == nTerm) {
            cVar18 = (uVar14 == local_44) + '\x01';
          }
          else if ((local_44 <= uVar14) ||
                  (cVar18 = '\x01', puVar23[uVar14 + uVar21] <= pTerm[uVar17])) {
            cVar18 = '\0';
          }
          if (cVar18 != '\0') {
            local_48 = uVar10;
            local_3c = uVar21;
            if (cVar18 == '\x01') goto LAB_001e7474;
            goto LAB_001e7561;
          }
        }
        if (uVar20 <= local_6c) {
          bVar4 = false;
          goto LAB_001e7474;
        }
        iVar9 = sqlite3Fts5GetVarint32(puVar23 + local_6c,&local_40);
        uVar10 = uVar10 + local_40;
        if (uVar10 < uVar20) {
          local_6c = local_6c + iVar9;
          uVar21 = uVar10 + 1;
          local_40 = (u32)puVar23[uVar10];
          if ((char)puVar23[uVar10] < '\0') {
            iVar9 = sqlite3Fts5GetVarint32(puVar23 + uVar10,&local_40);
            uVar21 = iVar9 + uVar10;
          }
          goto LAB_001e733b;
        }
        *pRc = 0x10b;
        local_48 = uVar10;
        local_3c = uVar10;
      }
    }
    goto LAB_001e7634;
  }
  goto LAB_001e78e7;
  while( true ) {
    local_6c = pFVar12->szLeaf;
    uVar20 = pFVar12->nn;
    if ((int)local_6c < (int)uVar20) break;
LAB_001e74ad:
    fts5SegIterNextPage(p,pIter);
    pFVar12 = pIter->pLeaf;
    if (pFVar12 == (Fts5Data *)0x0) goto LAB_001e7634;
  }
  puVar23 = pFVar12->p;
  iVar9 = sqlite3Fts5GetVarint32(puVar23 + local_6c,&local_3c);
  uVar10 = local_3c;
  uVar11 = (ulong)local_3c;
  if ((3 < uVar11) && ((long)uVar11 < (long)(int)local_6c)) {
    local_6c = iVar9 + local_6c;
    local_40 = 0;
    local_48 = local_3c;
    iVar9 = sqlite3Fts5GetVarint32(puVar23 + uVar11,&local_44);
    local_3c = iVar9 + uVar10;
LAB_001e7561:
    uVar10 = local_44;
    if (((ulong)local_44 != 0) && (uVar11 = (ulong)local_3c, local_44 + uVar11 <= (ulong)uVar20)) {
      pIter->iLeafOffset = (ulong)(local_44 + local_3c);
      pIter->iTermLeafOffset = local_44 + local_3c;
      pIter->iTermLeafPgno = pIter->iLeafPgno;
      (pIter->term).n = 0;
      sqlite3Fts5BufferAppendBlob(pRc,&pIter->term,local_40,pTerm);
      sqlite3Fts5BufferAppendBlob(pRc,&pIter->term,uVar10,puVar23 + uVar11);
      if (local_6c < uVar20) {
        local_4c = 0xaaaaaaaa;
        iVar9 = sqlite3Fts5GetVarint32(puVar23 + local_6c,&local_4c);
        local_6c = local_6c + iVar9;
        iVar9 = local_4c + local_48;
      }
      else {
        iVar9 = pIter->pLeaf->nn + 1;
      }
      pIter->iEndofDoclist = iVar9;
      pIter->iPgidxOff = local_6c;
      fts5SegIterLoadRowid(p,pIter);
      fts5SegIterLoadNPos(p,pIter);
      goto LAB_001e7634;
    }
  }
  *pRc = 0x10b;
LAB_001e7634:
  if (((flags & 0x108U) != 8) && (*pRc == 0)) {
    uVar20 = pIter->flags;
    pIter->flags = uVar20 | 1;
    if (pIter->pLeaf != (Fts5Data *)0x0) {
      if ((flags & 2U) != 0) {
        pIter->flags = uVar20 | 3;
      }
      if (iVar7 <= iVar8 && !bVar24) {
        fts5SegIterLoadDlidx(p,pIter);
      }
      if ((flags & 2U) != 0) {
        if ((pIter->pDlidx == (Fts5DlidxIter *)0x0) || (p->pConfig->iVersion != 4)) {
          iVar7 = pIter->iLeafPgno;
          lVar22 = (long)iVar7;
          iVar8 = 4;
          if (pIter->iTermLeafPgno == iVar7) {
            iVar8 = pIter->iTermLeafOffset;
          }
          lVar16 = (long)iVar8 << 0x20;
          lVar19 = (long)iVar8;
          do {
            lVar16 = lVar16 + 0x100000000;
            if (-1 < (char)pIter->pLeaf->p[lVar19]) break;
            bVar24 = lVar19 < iVar8 + 8;
            lVar19 = lVar19 + 1;
          } while (bVar24);
          pIter->iLeafOffset = lVar16 >> 0x20;
          if (pIter->iEndofDoclist < pIter->pLeaf->szLeaf) {
            local_90 = 0;
            local_80 = (Fts5Data *)0x0;
          }
          else {
            pFVar2 = pIter->pSeg;
            local_90 = 0;
            local_80 = (Fts5Data *)0x0;
            do {
              iVar7 = iVar7 + 1;
              if ((*pRc != 0) || (pFVar2->pgnoLast <= lVar22)) break;
              pFVar12 = fts5LeafRead(p,lVar22 + ((ulong)(uint)pFVar2->iSegid << 0x25) + 1);
              if (pFVar12 == (Fts5Data *)0x0) {
                bVar24 = true;
              }
              else {
                bVar24 = pFVar12->nn <= pFVar12->szLeaf;
                pFVar15 = local_80;
                if (pFVar12->p[1] != '\0' || *pFVar12->p != '\0') {
                  pFVar15 = pFVar12;
                  local_90 = iVar7;
                  pFVar12 = local_80;
                }
                sqlite3_free(pFVar12);
                local_80 = pFVar15;
              }
              lVar22 = lVar22 + 1;
            } while (bVar24);
          }
        }
        else {
          local_90 = pIter->pDlidx->aLvl[0].iLeafPgno;
          local_80 = fts5LeafRead(p,((ulong)(uint)pIter->pSeg->iSegid << 0x25) + (long)local_90);
        }
        if (local_80 != (Fts5Data *)0x0) {
          sqlite3_free(pIter->pLeaf);
          pIter->pLeaf = local_80;
          pIter->iLeafPgno = local_90;
          uVar6 = *(ushort *)local_80->p;
          uVar6 = uVar6 << 8 | uVar6 >> 8;
          iVar7 = local_80->szLeaf;
          if (iVar7 < (int)(uint)uVar6) {
            *pRc = 0x10b;
          }
          else {
            bVar5 = sqlite3Fts5GetVarint
                              ((uchar *)((long)local_80->p + (ulong)uVar6),(u64 *)&pIter->iRowid);
            pIter->iLeafOffset = (ulong)((uint)bVar5 + (uint)uVar6);
            if (local_80->szLeaf < local_80->nn) {
              local_3c = 0xaaaaaaaa;
              sqlite3Fts5GetVarint32(local_80->p + local_80->szLeaf,&local_3c);
              uVar10 = local_3c;
            }
            else {
              uVar10 = local_80->nn + 1;
            }
            pIter->iEndofDoclist = uVar10;
          }
          if (iVar7 < (int)(uint)uVar6) goto LAB_001e788d;
        }
        fts5SegIterReverseInitPage(p,pIter);
      }
    }
  }
LAB_001e788d:
  if ((pIter->flags & 2) == 0) {
    if (p->pConfig->eDetail == 1) {
      pcVar13 = fts5SegIterNext_None;
    }
    else {
      pcVar13 = fts5SegIterNext;
    }
  }
  else {
    pcVar13 = fts5SegIterNext_Reverse;
  }
  pIter->xNext = pcVar13;
  if (((uint)flags >> 8 & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      fts5SegIterAllocTombstone(p,pIter);
      return;
    }
    goto LAB_001e7936;
  }
LAB_001e78e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001e7936:
  __stack_chk_fail();
}

Assistant:

static void fts5SegIterSeekInit(
  Fts5Index *p,                   /* FTS5 backend */
  const u8 *pTerm, int nTerm,     /* Term to seek to */
  int flags,                      /* Mask of FTS5INDEX_XXX flags */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  int iPg = 1;
  int bGe = (flags & FTS5INDEX_QUERY_SCAN);
  int bDlidx = 0;                 /* True if there is a doclist-index */
  sqlite3_stmt *pIdxSelect = 0;

  assert( bGe==0 || (flags & FTS5INDEX_QUERY_DESC)==0 );
  assert( pTerm && nTerm );
  memset(pIter, 0, sizeof(*pIter));
  pIter->pSeg = pSeg;

  /* This block sets stack variable iPg to the leaf page number that may
  ** contain term (pTerm/nTerm), if it is present in the segment. */
  pIdxSelect = fts5IdxSelectStmt(p);
  if( p->rc ) return;
  sqlite3_bind_int(pIdxSelect, 1, pSeg->iSegid);
  sqlite3_bind_blob(pIdxSelect, 2, pTerm, nTerm, SQLITE_STATIC);
  if( SQLITE_ROW==sqlite3_step(pIdxSelect) ){
    i64 val = sqlite3_column_int(pIdxSelect, 0);
    iPg = (int)(val>>1);
    bDlidx = (val & 0x0001);
  }
  p->rc = sqlite3_reset(pIdxSelect);
  sqlite3_bind_null(pIdxSelect, 2);

  if( iPg<pSeg->pgnoFirst ){
    iPg = pSeg->pgnoFirst;
    bDlidx = 0;
  }

  pIter->iLeafPgno = iPg - 1;
  fts5SegIterNextPage(p, pIter);

  if( pIter->pLeaf ){
    fts5LeafSeek(p, bGe, pIter, pTerm, nTerm);
  }

  if( p->rc==SQLITE_OK && (bGe==0 || (flags & FTS5INDEX_QUERY_SCANONETERM)) ){
    pIter->flags |= FTS5_SEGITER_ONETERM;
    if( pIter->pLeaf ){
      if( flags & FTS5INDEX_QUERY_DESC ){
        pIter->flags |= FTS5_SEGITER_REVERSE;
      }
      if( bDlidx ){
        fts5SegIterLoadDlidx(p, pIter);
      }
      if( flags & FTS5INDEX_QUERY_DESC ){
        fts5SegIterReverse(p, pIter);
      }
    }
  }

  fts5SegIterSetNext(p, pIter);
  if( 0==(flags & FTS5INDEX_QUERY_SCANONETERM) ){
    fts5SegIterAllocTombstone(p, pIter);
  }

  /* Either:
  **
  **   1) an error has occurred, or
  **   2) the iterator points to EOF, or
  **   3) the iterator points to an entry with term (pTerm/nTerm), or
  **   4) the FTS5INDEX_QUERY_SCAN flag was set and the iterator points
  **      to an entry with a term greater than or equal to (pTerm/nTerm).
  */
  assert_nc( p->rc!=SQLITE_OK                                       /* 1 */
   || pIter->pLeaf==0                                               /* 2 */
   || fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)==0          /* 3 */
   || (bGe && fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)>0)  /* 4 */
  );
}